

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O3

void __thiscall
psy::TextElementTable<psy::C::CharacterConstant>::reset
          (TextElementTable<psy::C::CharacterConstant> *this)

{
  int iVar1;
  Lexeme *this_00;
  long lVar2;
  CharacterConstant **__ptr;
  
  __ptr = this->elements_;
  if (__ptr != (CharacterConstant **)0x0) {
    iVar1 = this->count_;
    if (__ptr != __ptr + (long)iVar1 + 1) {
      lVar2 = 0;
      do {
        this_00 = *(Lexeme **)((long)__ptr + lVar2);
        if (this_00 != (Lexeme *)0x0) {
          C::Lexeme::~Lexeme(this_00);
        }
        operator_delete(this_00,0x30);
        lVar2 = lVar2 + 8;
      } while ((long)iVar1 * 8 + 8 != lVar2);
      __ptr = this->elements_;
    }
    free(__ptr);
  }
  if (this->buckets_ != (CharacterConstant **)0x0) {
    free(this->buckets_);
  }
  this->elements_ = (CharacterConstant **)0x0;
  this->buckets_ = (CharacterConstant **)0x0;
  this->count_ = -1;
  this->allocated_ = 0;
  this->bucketCount_ = 0;
  return;
}

Assistant:

void reset()
    {
        if (elements_) {
            ElemT** last = elements_ + count_ + 1;
            for (ElemT** it = elements_; it != last; ++it)
                delete *it;
            std::free(elements_);
        }

        if (buckets_)
            std::free(buckets_);

        elements_ = 0;
        buckets_ = 0;
        allocated_ = 0;
        count_ = -1;
        bucketCount_ = 0;
    }